

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall higan::Socket::SetReusePort(Socket *this)

{
  int iVar1;
  Logger local_230;
  undefined4 local_14 [2];
  int on;
  
  local_14[0] = 1;
  iVar1 = setsockopt(this->fd_,1,0xf,local_14,4);
  if (iVar1 == -1) {
    Logger::Logger(&local_230,FATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/HiganFish[P]higan/higan/Socket.cpp"
                   ,0x41,"SetReusePort");
    Logger::operator<<(&local_230,"set socket reuse port error");
    Logger::~Logger(&local_230);
  }
  return;
}

Assistant:

void Socket::SetReusePort()
{
	int on = 1;
	int result = setsockopt(fd_, SOL_SOCKET, SO_REUSEPORT, static_cast<void*>(&on),
			static_cast<socklen_t>(sizeof on));

	if (result == -1)
	{
		LOG_FATAL <<  "set socket reuse port error";
	}
}